

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

void Cof_ManPrintHighFanout(Cof_Man_t *p,int nNodes)

{
  int iVar1;
  void **__ptr;
  Vec_Ptr_t *__ptr_00;
  long lVar2;
  
  __ptr_00 = Cof_ManCollectHighFanout(p,nNodes);
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_006e68ff;
  }
  else {
    lVar2 = 0;
    do {
      Cof_ManPrintHighFanoutOne(p,(Cof_Obj_t *)__ptr[lVar2]);
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  free(__ptr);
LAB_006e68ff:
  free(__ptr_00);
  return;
}

Assistant:

void Cof_ManPrintHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Cof_ManCollectHighFanout( p, nNodes );
    Vec_PtrForEachEntry( Cof_Obj_t *, vNodes, pObj, i )
        Cof_ManPrintHighFanoutOne( p, pObj );
    Vec_PtrFree( vNodes );
}